

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkMiterQuantify(Abc_Ntk_t *pNtk,int In,int fExist)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  char *pcVar3;
  Abc_Obj_t *pRoot_00;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *local_48;
  Abc_Obj_t *pMiter;
  Abc_Obj_t *pOutput2;
  Abc_Obj_t *pOutput1;
  Abc_Obj_t *pRoot;
  Abc_Ntk_t *pNtkMiter;
  int fExist_local;
  int In_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMiter.c"
                  ,0x24b,"Abc_Ntk_t *Abc_NtkMiterQuantify(Abc_Ntk_t *, int, int)");
  }
  iVar1 = Abc_NtkCoNum(pNtk);
  if (iVar1 != 1) {
    __assert_fail("1 == Abc_NtkCoNum(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMiter.c"
                  ,0x24c,"Abc_Ntk_t *Abc_NtkMiterQuantify(Abc_Ntk_t *, int, int)");
  }
  iVar1 = Abc_NtkCiNum(pNtk);
  if (iVar1 <= In) {
    __assert_fail("In < Abc_NtkCiNum(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMiter.c"
                  ,0x24d,"Abc_Ntk_t *Abc_NtkMiterQuantify(Abc_Ntk_t *, int, int)");
  }
  iVar1 = Abc_NtkHasOnlyLatchBoxes(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkHasOnlyLatchBoxes(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMiter.c"
                  ,0x24e,"Abc_Ntk_t *Abc_NtkMiterQuantify(Abc_Ntk_t *, int, int)");
  }
  pNtk_local = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
  pAVar2 = Abc_NtkCo(pNtk,0);
  pcVar3 = Abc_ObjName(pAVar2);
  pcVar3 = Extra_UtilStrsav(pcVar3);
  pNtk_local->pName = pcVar3;
  pRoot_00 = Abc_NtkCo(pNtk,0);
  Abc_NtkMiterPrepare(pNtk,pNtk,pNtk_local,1,-1,0);
  pAVar2 = Abc_AigConst1(pNtk_local);
  pAVar2 = Abc_ObjNot(pAVar2);
  pAVar4 = Abc_NtkCi(pNtk,In);
  (pAVar4->field_6).pCopy = pAVar2;
  Abc_NtkMiterAddCone(pNtk,pNtk_local,pRoot_00);
  pAVar2 = Abc_ObjFanin0(pRoot_00);
  pAVar2 = (pAVar2->field_6).pCopy;
  iVar1 = Abc_ObjFaninC0(pRoot_00);
  pAVar4 = Abc_ObjNotCond(pAVar2,iVar1);
  pAVar2 = Abc_AigConst1(pNtk_local);
  pAVar5 = Abc_NtkCi(pNtk,In);
  (pAVar5->field_6).pCopy = pAVar2;
  Abc_NtkMiterAddCone(pNtk,pNtk_local,pRoot_00);
  pAVar2 = Abc_ObjFanin0(pRoot_00);
  pAVar2 = (pAVar2->field_6).pCopy;
  iVar1 = Abc_ObjFaninC0(pRoot_00);
  pAVar2 = Abc_ObjNotCond(pAVar2,iVar1);
  if (fExist == 0) {
    local_48 = Abc_AigAnd((Abc_Aig_t *)pNtk_local->pManFunc,pAVar4,pAVar2);
  }
  else {
    local_48 = Abc_AigOr((Abc_Aig_t *)pNtk_local->pManFunc,pAVar4,pAVar2);
  }
  pAVar2 = Abc_NtkPo(pNtk_local,0);
  Abc_ObjAddFanin(pAVar2,local_48);
  iVar1 = Abc_NtkCheck(pNtk_local);
  if (iVar1 == 0) {
    printf("Abc_NtkMiter: The network check has failed.\n");
    Abc_NtkDelete(pNtk_local);
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkMiterQuantify( Abc_Ntk_t * pNtk, int In, int fExist )
{
    Abc_Ntk_t * pNtkMiter;
    Abc_Obj_t * pRoot, * pOutput1, * pOutput2, * pMiter;

    assert( Abc_NtkIsStrash(pNtk) );
    assert( 1 == Abc_NtkCoNum(pNtk) );
    assert( In < Abc_NtkCiNum(pNtk) );
    assert( Abc_NtkHasOnlyLatchBoxes(pNtk) );

    // start the new network
    pNtkMiter = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    pNtkMiter->pName = Extra_UtilStrsav( Abc_ObjName(Abc_NtkCo(pNtk, 0)) );

    // get the root output
    pRoot = Abc_NtkCo( pNtk, 0 );

    // perform strashing
    Abc_NtkMiterPrepare( pNtk, pNtk, pNtkMiter, 1, -1, 0 );
    // set the first cofactor
    Abc_NtkCi(pNtk, In)->pCopy = Abc_ObjNot( Abc_AigConst1(pNtkMiter) );
    // add the first cofactor
    Abc_NtkMiterAddCone( pNtk, pNtkMiter, pRoot );
    // save the output
//    pOutput1 = Abc_ObjFanin0(pRoot)->pCopy;
    pOutput1 = Abc_ObjNotCond( Abc_ObjFanin0(pRoot)->pCopy, Abc_ObjFaninC0(pRoot) );

    // set the second cofactor
    Abc_NtkCi(pNtk, In)->pCopy = Abc_AigConst1(pNtkMiter);
    // add the second cofactor
    Abc_NtkMiterAddCone( pNtk, pNtkMiter, pRoot );
    // save the output
//    pOutput2 = Abc_ObjFanin0(pRoot)->pCopy;
    pOutput2 = Abc_ObjNotCond( Abc_ObjFanin0(pRoot)->pCopy, Abc_ObjFaninC0(pRoot) );

    // create the miter of the two outputs
    if ( fExist ) 
        pMiter = Abc_AigOr( (Abc_Aig_t *)pNtkMiter->pManFunc, pOutput1, pOutput2 );
    else
        pMiter = Abc_AigAnd( (Abc_Aig_t *)pNtkMiter->pManFunc, pOutput1, pOutput2 );
    Abc_ObjAddFanin( Abc_NtkPo(pNtkMiter,0), pMiter );

    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtkMiter ) )
    {
        printf( "Abc_NtkMiter: The network check has failed.\n" );
        Abc_NtkDelete( pNtkMiter );
        return NULL;
    }
    return pNtkMiter;
}